

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::SystemTimingCheckSymbol::serializeTo
          (SystemTimingCheckSymbol *this,ASTSerializer *serializer)

{
  string_view value;
  string_view name;
  string_view name_00;
  bool bVar1;
  size_type __len;
  ASTSerializer *in_RSI;
  array<char,_2UL> *desc;
  iterator __end4;
  iterator __begin4;
  span<const_std::array<char,_2UL>,_18446744073709551615UL> *__range4;
  Arg *arg;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL> *__range2;
  SystemTimingCheckSymbol *in_stack_fffffffffffffec8;
  ASTSerializer *in_stack_fffffffffffffed0;
  ASTSerializer *in_stack_fffffffffffffed8;
  ASTSerializer *in_stack_fffffffffffffee0;
  ASTSerializer *in_stack_fffffffffffffee8;
  ASTSerializer *in_stack_fffffffffffffef0;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  array<char,_2UL> *local_e0;
  array<char,_2UL> *local_d8;
  __normal_iterator<const_std::array<char,_2UL>_*,_std::span<const_std::array<char,_2UL>,_18446744073709551615UL>_>
  local_d0;
  span<const_std::array<char,_2UL>,_18446744073709551615UL> *local_c8;
  string_view local_b0;
  undefined8 local_a0;
  void *local_98;
  undefined8 local_90;
  void *local_88;
  undefined8 local_80;
  void *local_78;
  reference local_70;
  Arg *local_68;
  __normal_iterator<const_slang::ast::SystemTimingCheckSymbol::Arg_*,_std::span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL>_>
  local_60;
  span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL> local_58;
  span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL> *local_48;
  string_view local_30;
  int local_20;
  void *local_18;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             (char *)in_stack_fffffffffffffed8);
  local_30 = ast::toString(Unknown);
  ASTSerializer::write(in_RSI,local_20,local_18,local_30._M_len);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             (char *)in_stack_fffffffffffffed8);
  name._M_str = (char *)in_stack_fffffffffffffef0;
  name._M_len = (size_t)in_stack_fffffffffffffee8;
  ASTSerializer::startArray(in_stack_fffffffffffffee0,name);
  local_58 = getArguments(in_stack_fffffffffffffec8);
  local_48 = &local_58;
  local_60._M_current =
       (Arg *)std::span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL>::
              begin((span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL> *)
                    in_stack_fffffffffffffec8);
  local_68 = (Arg *)std::
                    span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL>::
                    end((span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL>
                         *)in_stack_fffffffffffffed8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::SystemTimingCheckSymbol::Arg_*,_std::span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::SystemTimingCheckSymbol::Arg_*,_std::span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffed0,
                       (__normal_iterator<const_slang::ast::SystemTimingCheckSymbol::Arg_*,_std::span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffec8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_70 = __gnu_cxx::
               __normal_iterator<const_slang::ast::SystemTimingCheckSymbol::Arg_*,_std::span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL>_>
               ::operator*(&local_60);
    ASTSerializer::startObject((ASTSerializer *)0x109cbdd);
    if (local_70->expr != (Expression *)0x0) {
      in_stack_fffffffffffffef0 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
                 (char *)in_stack_fffffffffffffed8);
      ASTSerializer::write(in_stack_fffffffffffffef0,(int)local_80,local_78,(size_t)local_70->expr);
    }
    if (local_70->condition != (Expression *)0x0) {
      in_stack_fffffffffffffee8 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
                 (char *)in_stack_fffffffffffffed8);
      ASTSerializer::write
                (in_stack_fffffffffffffee8,(int)local_90,local_88,(size_t)local_70->condition);
    }
    if (local_70->edge != None) {
      in_stack_fffffffffffffee0 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_10,
                 (char *)in_stack_fffffffffffffed8);
      local_b0 = ast::toString(None);
      ASTSerializer::write(in_stack_fffffffffffffee0,(int)local_a0,local_98,local_b0._M_len);
    }
    bVar1 = std::span<const_std::array<char,_2UL>,_18446744073709551615UL>::empty
                      ((span<const_std::array<char,_2UL>,_18446744073709551615UL> *)0x109cd11);
    if (!bVar1) {
      in_stack_fffffffffffffed8 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
                 (char *)local_10);
      name_00._M_str = (char *)in_stack_fffffffffffffef0;
      name_00._M_len = (size_t)in_stack_fffffffffffffee8;
      ASTSerializer::startArray(in_stack_fffffffffffffee0,name_00);
      local_c8 = &local_70->edgeDescriptors;
      local_d0._M_current =
           (array<char,_2UL> *)
           std::span<const_std::array<char,_2UL>,_18446744073709551615UL>::begin
                     ((span<const_std::array<char,_2UL>,_18446744073709551615UL> *)
                      in_stack_fffffffffffffec8);
      local_d8 = (array<char,_2UL> *)
                 std::span<const_std::array<char,_2UL>,_18446744073709551615UL>::end
                           ((span<const_std::array<char,_2UL>,_18446744073709551615UL> *)
                            in_stack_fffffffffffffed8);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_std::array<char,_2UL>_*,_std::span<const_std::array<char,_2UL>,_18446744073709551615UL>_>
                          ((__normal_iterator<const_std::array<char,_2UL>_*,_std::span<const_std::array<char,_2UL>,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffed0,
                           (__normal_iterator<const_std::array<char,_2UL>_*,_std::span<const_std::array<char,_2UL>,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffec8);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_e0 = __gnu_cxx::
                   __normal_iterator<const_std::array<char,_2UL>_*,_std::span<const_std::array<char,_2UL>,_18446744073709551615UL>_>
                   ::operator*(&local_d0);
        in_stack_fffffffffffffed0 = local_10;
        in_stack_fffffffffffffec8 =
             (SystemTimingCheckSymbol *)std::array<char,_2UL>::data((array<char,_2UL> *)0x109cdba);
        __len = std::array<char,_2UL>::size(local_e0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_f0,(char *)in_stack_fffffffffffffec8,__len);
        value._M_str = (char *)in_stack_fffffffffffffee0;
        value._M_len = (size_t)in_stack_fffffffffffffed8;
        ASTSerializer::serialize(in_stack_fffffffffffffed0,value);
        __gnu_cxx::
        __normal_iterator<const_std::array<char,_2UL>_*,_std::span<const_std::array<char,_2UL>,_18446744073709551615UL>_>
        ::operator++(&local_d0);
      }
      ASTSerializer::endArray((ASTSerializer *)0x109ce06);
    }
    ASTSerializer::endObject((ASTSerializer *)0x109ce13);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::SystemTimingCheckSymbol::Arg_*,_std::span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL>_>
    ::operator++(&local_60);
  }
  ASTSerializer::endArray((ASTSerializer *)0x109ce32);
  return;
}

Assistant:

void SystemTimingCheckSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("timingCheckKind", toString(timingCheckKind));

    serializer.startArray("arguments");
    for (auto& arg : getArguments()) {
        serializer.startObject();
        if (arg.expr)
            serializer.write("expr", *arg.expr);
        if (arg.condition)
            serializer.write("condition", *arg.condition);
        if (arg.edge != EdgeKind::None)
            serializer.write("edge", toString(arg.edge));

        if (!arg.edgeDescriptors.empty()) {
            serializer.startArray("edgeDescriptors");
            for (auto& desc : arg.edgeDescriptors)
                serializer.serialize(std::string_view(desc.data(), desc.size()));
            serializer.endArray();
        }

        serializer.endObject();
    }
    serializer.endArray();
}